

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

ImGuiTabItem * ImGui::TabBarFindTabByID(ImGuiTabBar *tab_bar,ImGuiID tab_id)

{
  uint uVar1;
  long lVar2;
  ImGuiTabItem *pIVar3;
  ImGuiTabItem *pIVar4;
  long lVar5;
  
  pIVar3 = (ImGuiTabItem *)0x0;
  if (tab_id != 0) {
    uVar1 = (tab_bar->Tabs).Size;
    pIVar4 = (ImGuiTabItem *)(ulong)uVar1;
    if ((int)uVar1 < 1) {
      pIVar4 = pIVar3;
    }
    lVar2 = -0x24;
    do {
      lVar5 = lVar2;
      if ((long)pIVar4 * 0x24 - (lVar5 + 0x24) == 0) {
        return (ImGuiTabItem *)0x0;
      }
      pIVar3 = (tab_bar->Tabs).Data;
      lVar2 = lVar5 + 0x24;
    } while (*(ImGuiID *)((long)&pIVar3[1].ID + lVar5) != tab_id);
    pIVar3 = (ImGuiTabItem *)((long)&pIVar3[1].ID + lVar5);
  }
  return pIVar3;
}

Assistant:

ImGuiTabItem* ImGui::TabBarFindTabByID(ImGuiTabBar* tab_bar, ImGuiID tab_id)
{
    if (tab_id != 0)
        for (int n = 0; n < tab_bar->Tabs.Size; n++)
            if (tab_bar->Tabs[n].ID == tab_id)
                return &tab_bar->Tabs[n];
    return NULL;
}